

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O1

bool ON_Intersect(ON_Plane *R,ON_Plane *S,ON_Line *L)

{
  bool bVar1;
  ON_3dVector d;
  ON_3dPoint p;
  ON_Plane T;
  ON_3dPoint local_f8;
  ON_3dVector local_e0;
  ON_3dPoint local_c8;
  ON_Plane local_b0;
  
  ON_CrossProduct(&local_e0,&S->zaxis,&R->zaxis);
  ON_3dPoint::operator+(&local_b0.origin,&R->origin,&S->origin);
  operator*(&local_c8,0.5,&local_b0.origin);
  ON_Plane::ON_Plane(&local_b0,&local_c8,&local_e0);
  bVar1 = ON_Intersect(R,S,&local_b0,&L->from);
  ON_3dPoint::operator+(&local_f8,&L->from,&local_e0);
  (L->to).z = local_f8.z;
  (L->to).x = local_f8.x;
  (L->to).y = local_f8.y;
  ON_Plane::~ON_Plane(&local_b0);
  return bVar1;
}

Assistant:

bool ON_Intersect( const ON_Plane& R, const ON_Plane& S,
                   ON_Line& L )
{
  ON_3dVector d = ON_CrossProduct( S.zaxis, R.zaxis );
  ON_3dPoint p = 0.5*(R.origin + S.origin);
  ON_Plane T( p, d );
  bool rc = ON_Intersect( R, S, T, L.from );
  L.to = L.from + d;
  return rc;
}